

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_block_decoder.c
# Opt level: O0

int pt_blk_next(pt_block_decoder *decoder,pt_block *ublock,size_t size)

{
  int iVar1;
  pt_block *local_70;
  int status;
  int errcode;
  pt_block *pblock;
  pt_block block;
  size_t size_local;
  pt_block *ublock_local;
  pt_block_decoder *decoder_local;
  
  if ((decoder == (pt_block_decoder *)0x0) || (ublock == (pt_block *)0x0)) {
    decoder_local._4_4_ = -2;
  }
  else {
    local_70 = ublock;
    if (size != 0x30) {
      local_70 = (pt_block *)&pblock;
    }
    block._40_8_ = size;
    memset(local_70,0,0x30);
    local_70->ip = decoder->ip;
    local_70->mode = decoder->mode;
    if ((*(ushort *)&decoder->field_0xa74 >> 1 & 1) != 0) {
      local_70->field_0x2e = local_70->field_0x2e & 0xfe | 1;
    }
    decoder_local._4_4_ = pt_blk_proceed(decoder,local_70);
    iVar1 = block_to_user(ublock,block._40_8_,local_70);
    if (iVar1 < 0) {
      decoder_local._4_4_ = iVar1;
    }
  }
  return decoder_local._4_4_;
}

Assistant:

int pt_blk_next(struct pt_block_decoder *decoder, struct pt_block *ublock,
		size_t size)
{
	struct pt_block block, *pblock;
	int errcode, status;

	if (!decoder || !ublock)
		return -pte_invalid;

	pblock = size == sizeof(block) ? ublock : &block;

	/* Zero-initialize the block in case of error returns. */
	memset(pblock, 0, sizeof(*pblock));

	/* Fill in a few things from the current decode state.
	 *
	 * This reflects the state of the last pt_blk_next() or pt_blk_start()
	 * call.  Note that, unless we stop with tracing disabled, we proceed
	 * already to the start IP of the next block.
	 *
	 * Some of the state may later be overwritten as we process events.
	 */
	pblock->ip = decoder->ip;
	pblock->mode = decoder->mode;
	if (decoder->speculative)
		pblock->speculative = 1;

	/* Proceed one block. */
	status = pt_blk_proceed(decoder, pblock);

	errcode = block_to_user(ublock, size, pblock);
	if (errcode < 0)
		return errcode;

	return status;
}